

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV2MaterialBlock(Parser *this,Material *mat)

{
  bool bVar1;
  vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_> *this_00;
  ulong __new_size;
  reference mat_00;
  Material *sMat;
  uint iIndex;
  allocator local_329;
  string local_328;
  Material local_308;
  ai_real local_24;
  uint local_20;
  ai_real f;
  uint iNumSubMaterials;
  int iDepth;
  Material *mat_local;
  Parser *this_local;
  
  f = 0.0;
  local_20 = 0;
  _iNumSubMaterials = mat;
  mat_local = (Material *)this;
LAB_00633bdc:
  do {
    while (*this->filePtr != '*') {
LAB_006342b4:
      if (*this->filePtr == '{') {
        f = (ai_real)((int)f + 1);
      }
      else if (*this->filePtr == '}') {
        f = (ai_real)((int)f + -1);
        if (f == 0.0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a *MATERIAL chunk (Level 2)");
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_NAME",0xd);
    if (!bVar1) {
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_AMBIENT",0x10);
      if (bVar1) {
        ParseLV4MeshFloatTriple(this,&(_iNumSubMaterials->super_Material).mAmbient.r);
      }
      else {
        bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_DIFFUSE",0x10);
        if (bVar1) {
          ParseLV4MeshFloatTriple(this,&(_iNumSubMaterials->super_Material).mDiffuse.r);
        }
        else {
          bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_SPECULAR",0x11);
          if (bVar1) {
            ParseLV4MeshFloatTriple(this,&(_iNumSubMaterials->super_Material).mSpecular.r);
          }
          else {
            bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_SHADING",0x10);
            if (bVar1) {
              bVar1 = TokenMatch<char_const>(&this->filePtr,"Blinn",5);
              if (bVar1) {
                (_iNumSubMaterials->super_Material).mShading = Blinn;
              }
              else {
                bVar1 = TokenMatch<char_const>(&this->filePtr,"Phong",5);
                if (bVar1) {
                  (_iNumSubMaterials->super_Material).mShading = Phong;
                }
                else {
                  bVar1 = TokenMatch<char_const>(&this->filePtr,"Flat",4);
                  if (bVar1) {
                    (_iNumSubMaterials->super_Material).mShading = Flat;
                  }
                  else {
                    bVar1 = TokenMatch<char_const>(&this->filePtr,"Wire",4);
                    if (bVar1) {
                      (_iNumSubMaterials->super_Material).mShading = Wire;
                    }
                    else {
                      (_iNumSubMaterials->super_Material).mShading = Gouraud;
                      SkipToNextToken(this);
                    }
                  }
                }
              }
            }
            else {
              bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_TRANSPARENCY",0x15);
              if (bVar1) {
                ParseLV4MeshFloat(this,&(_iNumSubMaterials->super_Material).mTransparency);
                (_iNumSubMaterials->super_Material).mTransparency =
                     1.0 - (_iNumSubMaterials->super_Material).mTransparency;
              }
              else {
                bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_SELFILLUM",0x12);
                if (bVar1) {
                  local_24 = 0.0;
                  ParseLV4MeshFloat(this,&local_24);
                  (_iNumSubMaterials->super_Material).mEmissive.r = local_24;
                  (_iNumSubMaterials->super_Material).mEmissive.g = local_24;
                  (_iNumSubMaterials->super_Material).mEmissive.b = local_24;
                }
                else {
                  bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_SHINE",0xe);
                  if (bVar1) {
                    ParseLV4MeshFloat(this,&(_iNumSubMaterials->super_Material).mSpecularExponent);
                    (_iNumSubMaterials->super_Material).mSpecularExponent =
                         (_iNumSubMaterials->super_Material).mSpecularExponent * 15.0;
                  }
                  else {
                    bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_TWOSIDED",0x11);
                    if (bVar1) {
                      (_iNumSubMaterials->super_Material).mTwoSided = true;
                    }
                    else {
                      bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_SHINESTRENGTH",0x16);
                      if (bVar1) {
                        ParseLV4MeshFloat(this,&(_iNumSubMaterials->super_Material).
                                                mShininessStrength);
                      }
                      else {
                        bVar1 = TokenMatch<char_const>(&this->filePtr,"MAP_DIFFUSE",0xb);
                        if (bVar1) {
                          ParseLV3MapBlock(this,&(_iNumSubMaterials->super_Material).sTexDiffuse);
                        }
                        else {
                          bVar1 = TokenMatch<char_const>(&this->filePtr,"MAP_AMBIENT",0xb);
                          if (bVar1) {
                            ParseLV3MapBlock(this,&(_iNumSubMaterials->super_Material).sTexAmbient);
                          }
                          else {
                            bVar1 = TokenMatch<char_const>(&this->filePtr,"MAP_SPECULAR",0xc);
                            if (bVar1) {
                              ParseLV3MapBlock(this,&(_iNumSubMaterials->super_Material).
                                                     sTexSpecular);
                            }
                            else {
                              bVar1 = TokenMatch<char_const>(&this->filePtr,"MAP_OPACITY",0xb);
                              if (bVar1) {
                                ParseLV3MapBlock(this,&(_iNumSubMaterials->super_Material).
                                                       sTexOpacity);
                              }
                              else {
                                bVar1 = TokenMatch<char_const>(&this->filePtr,"MAP_SELFILLUM",0xd);
                                if (bVar1) {
                                  ParseLV3MapBlock(this,&(_iNumSubMaterials->super_Material).
                                                         sTexEmissive);
                                }
                                else {
                                  bVar1 = TokenMatch<char_const>(&this->filePtr,"MAP_BUMP",8);
                                  if (bVar1) {
                                    ParseLV3MapBlock(this,&(_iNumSubMaterials->super_Material).
                                                           sTexBump);
                                  }
                                  bVar1 = TokenMatch<char_const>
                                                    (&this->filePtr,"MAP_SHINESTRENGTH",0x11);
                                  if (bVar1) {
                                    ParseLV3MapBlock(this,&(_iNumSubMaterials->super_Material).
                                                           sTexShininess);
                                  }
                                  else {
                                    bVar1 = TokenMatch<char_const>(&this->filePtr,"NUMSUBMTLS",10);
                                    if (bVar1) {
                                      ParseLV4MeshLong(this,&local_20);
                                      this_00 = &_iNumSubMaterials->avSubMaterials;
                                      __new_size = (ulong)local_20;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)&local_328,"INVALID SUBMATERIAL",
                                                 &local_329);
                                      ASE::Material::Material(&local_308,&local_328);
                                      std::
                                      vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                      ::resize(this_00,__new_size,&local_308);
                                      ASE::Material::~Material(&local_308);
                                      std::__cxx11::string::~string((string *)&local_328);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_329);
                                    }
                                    bVar1 = TokenMatch<char_const>(&this->filePtr,"SUBMATERIAL",0xb)
                                    ;
                                    if (!bVar1) goto LAB_006342b4;
                                    sMat._0_4_ = 0;
                                    ParseLV4MeshLong(this,(uint *)&sMat);
                                    if (local_20 <= (uint)sMat) {
                                      LogWarning(this,"Out of range: submaterial index is too large"
                                                );
                                      sMat._0_4_ = local_20 - 1;
                                    }
                                    mat_00 = std::
                                             vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>
                                             ::operator[](&_iNumSubMaterials->avSubMaterials,
                                                          (ulong)(uint)sMat);
                                    ParseLV2MaterialBlock(this,mat_00);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00633bdc;
    }
    bVar1 = ParseString(this,&(_iNumSubMaterials->super_Material).mName,"*MATERIAL_NAME");
    if (!bVar1) {
      SkipToNextToken(this);
    }
  } while( true );
}

Assistant:

void Parser::ParseLV2MaterialBlock(ASE::Material& mat)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumSubMaterials = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"MATERIAL_NAME",13))
            {
                if (!ParseString(mat.mName,"*MATERIAL_NAME"))
                    SkipToNextToken();
                continue;
            }
            // ambient material color
            if (TokenMatch(filePtr,"MATERIAL_AMBIENT",16))
            {
                ParseLV4MeshFloatTriple(&mat.mAmbient.r);
                continue;
            }
            // diffuse material color
            if (TokenMatch(filePtr,"MATERIAL_DIFFUSE",16) )
            {
                ParseLV4MeshFloatTriple(&mat.mDiffuse.r);
                continue;
            }
            // specular material color
            if (TokenMatch(filePtr,"MATERIAL_SPECULAR",17))
            {
                ParseLV4MeshFloatTriple(&mat.mSpecular.r);
                continue;
            }
            // material shading type
            if (TokenMatch(filePtr,"MATERIAL_SHADING",16))
            {
                if (TokenMatch(filePtr,"Blinn",5))
                {
                    mat.mShading = Discreet3DS::Blinn;
                }
                else if (TokenMatch(filePtr,"Phong",5))
                {
                    mat.mShading = Discreet3DS::Phong;
                }
                else if (TokenMatch(filePtr,"Flat",4))
                {
                    mat.mShading = Discreet3DS::Flat;
                }
                else if (TokenMatch(filePtr,"Wire",4))
                {
                    mat.mShading = Discreet3DS::Wire;
                }
                else
                {
                    // assume gouraud shading
                    mat.mShading = Discreet3DS::Gouraud;
                    SkipToNextToken();
                }
                continue;
            }
            // material transparency
            if (TokenMatch(filePtr,"MATERIAL_TRANSPARENCY",21))
            {
                ParseLV4MeshFloat(mat.mTransparency);
                mat.mTransparency = ai_real( 1.0 ) - mat.mTransparency;
                continue;
            }
            // material self illumination
            if (TokenMatch(filePtr,"MATERIAL_SELFILLUM",18))
            {
                ai_real f = 0.0;
                ParseLV4MeshFloat(f);

                mat.mEmissive.r = f;
                mat.mEmissive.g = f;
                mat.mEmissive.b = f;
                continue;
            }
            // material shininess
            if (TokenMatch(filePtr,"MATERIAL_SHINE",14) )
            {
                ParseLV4MeshFloat(mat.mSpecularExponent);
                mat.mSpecularExponent *= 15;
                continue;
            }
            // two-sided material
            if (TokenMatch(filePtr,"MATERIAL_TWOSIDED",17) )
            {
                mat.mTwoSided = true;
                continue;
            }
            // material shininess strength
            if (TokenMatch(filePtr,"MATERIAL_SHINESTRENGTH",22))
            {
                ParseLV4MeshFloat(mat.mShininessStrength);
                continue;
            }
            // diffuse color map
            if (TokenMatch(filePtr,"MAP_DIFFUSE",11))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexDiffuse);
                continue;
            }
            // ambient color map
            if (TokenMatch(filePtr,"MAP_AMBIENT",11))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexAmbient);
                continue;
            }
            // specular color map
            if (TokenMatch(filePtr,"MAP_SPECULAR",12))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexSpecular);
                continue;
            }
            // opacity map
            if (TokenMatch(filePtr,"MAP_OPACITY",11))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexOpacity);
                continue;
            }
            // emissive map
            if (TokenMatch(filePtr,"MAP_SELFILLUM",13))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexEmissive);
                continue;
            }
            // bump map
            if (TokenMatch(filePtr,"MAP_BUMP",8))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexBump);
            }
            // specular/shininess map
            if (TokenMatch(filePtr,"MAP_SHINESTRENGTH",17))
            {
                // parse the texture block
                ParseLV3MapBlock(mat.sTexShininess);
                continue;
            }
            // number of submaterials
            if (TokenMatch(filePtr,"NUMSUBMTLS",10))
            {
                ParseLV4MeshLong(iNumSubMaterials);

                // allocate enough storage
                mat.avSubMaterials.resize(iNumSubMaterials, Material("INVALID SUBMATERIAL"));
            }
            // submaterial chunks
            if (TokenMatch(filePtr,"SUBMATERIAL",11))
            {

                unsigned int iIndex = 0;
                ParseLV4MeshLong(iIndex);

                if (iIndex >= iNumSubMaterials)
                {
                    LogWarning("Out of range: submaterial index is too large");
                    iIndex = iNumSubMaterials-1;
                }

                // get a reference to the material
                Material& sMat = mat.avSubMaterials[iIndex];

                // parse the material block
                ParseLV2MaterialBlock(sMat);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","*MATERIAL");
    }
}